

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_reader_init_file(mz_zip_archive *pZip,char *pFilename,mz_uint32 flags)

{
  int iVar1;
  mz_bool mVar2;
  FILE *__stream;
  mz_uint64 mVar3;
  mz_uint32 flags_00;
  
  __stream = fopen(pFilename,"rb");
  if (__stream != (FILE *)0x0) {
    flags_00 = 0;
    iVar1 = fseeko(__stream,0,2);
    if (iVar1 == 0) {
      mVar3 = ftello(__stream);
      mVar2 = mz_zip_reader_init_internal(pZip,flags_00);
      if (mVar2 != 0) {
        pZip->m_pRead = mz_zip_file_read_func;
        pZip->m_pIO_opaque = pZip;
        pZip->m_pState->m_pFile = (FILE *)__stream;
        pZip->m_archive_size = mVar3;
        mVar2 = mz_zip_reader_read_central_dir(pZip,flags);
        if (mVar2 == 0) {
          mz_zip_reader_end(pZip);
          return 0;
        }
        return 1;
      }
    }
    fclose(__stream);
  }
  return 0;
}

Assistant:

mz_bool mz_zip_reader_init_file(mz_zip_archive *pZip, const char *pFilename,
                                mz_uint32 flags) {
  mz_uint64 file_size;
  MZ_FILE *pFile = MZ_FOPEN(pFilename, "rb");
  if (!pFile)
    return MZ_FALSE;
  if (MZ_FSEEK64(pFile, 0, SEEK_END)) {
    MZ_FCLOSE(pFile);
    return MZ_FALSE;
  }
  file_size = MZ_FTELL64(pFile);
  if (!mz_zip_reader_init_internal(pZip, flags)) {
    MZ_FCLOSE(pFile);
    return MZ_FALSE;
  }
  pZip->m_pRead = mz_zip_file_read_func;
  pZip->m_pIO_opaque = pZip;
  pZip->m_pState->m_pFile = pFile;
  pZip->m_archive_size = file_size;
  if (!mz_zip_reader_read_central_dir(pZip, flags)) {
    mz_zip_reader_end(pZip);
    return MZ_FALSE;
  }
  return MZ_TRUE;
}